

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O1

void duckdb::ListFlattenFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  ulong *puVar1;
  UnifiedVectorFormat *pUVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  long lVar5;
  byte bVar6;
  sel_t *psVar7;
  element_type *peVar8;
  unsigned_long uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  char cVar11;
  reference pvVar12;
  Vector *pVVar13;
  UnifiedVectorFormat *pUVar14;
  UnifiedVectorFormat *pUVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 *puVar19;
  idx_t count;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  idx_t idx_in_entry_1;
  sel_t sVar24;
  idx_t idx_in_entry;
  ulong uVar25;
  long lVar26;
  SelectionVector sel;
  UnifiedVectorFormat outer_format;
  UnifiedVectorFormat inner_format;
  UnifiedVectorFormat items_format;
  SelectionVector local_168;
  unsigned_long local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  SelectionVector *local_130;
  Vector *local_128;
  long local_120;
  ulong local_118;
  unsigned_long local_110;
  long *local_108;
  long local_100;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  puVar19 = *(undefined8 **)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  pvVar12 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pUVar2 = *(UnifiedVectorFormat **)(args + 0x18);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar12,pUVar2);
  if (pvVar12[8] == (value_type)0x1) {
    duckdb::Vector::Reference(result);
  }
  else {
    pVVar13 = (Vector *)duckdb::ListVector::GetEntry(pvVar12);
    pUVar14 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar12);
    duckdb::Vector::ToUnifiedFormat((ulong)pVVar13,pUVar14);
    if (pVVar13[8] == (Vector)0x1) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        pUVar14 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar15 = pUVar14;
          if (*local_108 != 0) {
            pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar14 * 4);
          }
          if ((local_f8 == 0) ||
             ((*(ulong *)(local_f8 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0
             )) {
            *puVar19 = 0;
            puVar19[1] = 0;
          }
          else {
            if (*(long *)(result + 0x28) == 0) {
              local_148 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_168,&local_148);
              peVar8 = local_168.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              psVar7 = local_168.sel_vector;
              local_168.sel_vector = (sel_t *)0x0;
              local_168.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(sel_t **)(result + 0x30) = psVar7;
              *(element_type **)(result + 0x38) = peVar8;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_168.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_168.selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              *(unsigned_long **)(result + 0x28) =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            bVar6 = (byte)pUVar14 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar14 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
          }
          pUVar14 = pUVar14 + 1;
          puVar19 = puVar19 + 2;
        } while (pUVar2 != pUVar14);
      }
      cVar11 = duckdb::DataChunk::AllConstant();
      if (cVar11 != '\0') {
        duckdb::Vector::SetVectorType((VectorType)result);
      }
    }
    else {
      local_130 = (SelectionVector *)duckdb::ListVector::GetEntry(pVVar13);
      pUVar14 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pVVar13);
      duckdb::Vector::ToUnifiedFormat((ulong)local_130,pUVar14);
      if (pUVar2 == (UnifiedVectorFormat *)0x0) {
        count = 0;
      }
      else {
        count = 0;
        pUVar14 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar15 = pUVar14;
          if (*local_108 != 0) {
            pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar14 * 4);
          }
          if ((local_f8 == 0) ||
             ((*(ulong *)(local_f8 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0
             )) {
            uVar21 = *(ulong *)(local_100 + (long)pUVar15 * 0x10);
            lVar22 = *(long *)(local_100 + 8 + (long)pUVar15 * 0x10);
            if (uVar21 < lVar22 + uVar21) {
              do {
                uVar20 = uVar21;
                if (*local_c0 != 0) {
                  uVar20 = (ulong)*(uint *)(*local_c0 + uVar21 * 4);
                }
                if ((local_b0 == 0) ||
                   ((*(ulong *)(local_b0 + (uVar20 >> 6) * 8) >> (uVar20 & 0x3f) & 1) != 0)) {
                  count = count + *(long *)(local_b8 + 8 + uVar20 * 0x10);
                }
                uVar21 = uVar21 + 1;
                lVar22 = lVar22 + -1;
              } while (lVar22 != 0);
            }
          }
          pUVar14 = pUVar14 + 1;
        } while (pUVar14 != pUVar2);
      }
      SelectionVector::SelectionVector(&local_168,count);
      if (pUVar2 == (UnifiedVectorFormat *)0x0) {
        uVar21 = 0;
      }
      else {
        local_120 = local_100;
        local_128 = result + 0x30;
        pUVar14 = (UnifiedVectorFormat *)0x0;
        uVar20 = 0;
        do {
          pUVar15 = pUVar14;
          if (*local_108 != 0) {
            pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar14 * 4);
          }
          uVar21 = uVar20;
          if ((local_f8 == 0) ||
             ((*(ulong *)(local_f8 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0
             )) {
            uVar17 = *(ulong *)(local_120 + (long)pUVar15 * 0x10);
            uVar18 = *(long *)(local_120 + 8 + (long)pUVar15 * 0x10) + uVar17;
            if (uVar17 < uVar18) {
              lVar4 = *local_c0;
              lVar22 = 0;
              do {
                uVar25 = uVar17;
                if (lVar4 != 0) {
                  uVar25 = (ulong)*(uint *)(lVar4 + uVar17 * 4);
                }
                if ((local_b0 == 0) ||
                   ((*(ulong *)(local_b0 + (uVar25 >> 6) * 8) >> (uVar25 & 0x3f) & 1) != 0)) {
                  uVar23 = *(ulong *)(local_b8 + uVar25 * 0x10);
                  lVar26 = *(long *)(local_b8 + 8 + uVar25 * 0x10);
                  lVar22 = lVar22 + lVar26;
                  if (uVar23 < uVar23 + lVar26) {
                    lVar5 = *local_78[0];
                    do {
                      sVar24 = (sel_t)uVar23;
                      if (lVar5 != 0) {
                        sVar24 = *(sel_t *)(lVar5 + uVar23 * 4);
                      }
                      local_168.sel_vector[uVar21] = sVar24;
                      uVar21 = uVar21 + 1;
                      uVar23 = uVar23 + 1;
                      lVar26 = lVar26 + -1;
                    } while (lVar26 != 0);
                  }
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar18);
            }
            else {
              lVar22 = 0;
            }
            puVar19[(long)pUVar14 * 2] = uVar20;
            puVar19[(long)pUVar14 * 2 + 1] = lVar22;
            local_118 = uVar20;
          }
          else {
            if (*(long *)(result + 0x28) == 0) {
              local_110 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_148,&local_110);
              p_Var10 = p_Stack_140;
              uVar9 = local_148;
              local_148 = 0;
              p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(unsigned_long *)(result + 0x30) = uVar9;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )local_128);
              *(unsigned_long **)(result + 0x28) =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            bVar6 = (byte)pUVar14 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar14 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
          }
          pUVar14 = pUVar14 + 1;
          uVar20 = uVar21;
        } while (pUVar14 != pUVar2);
      }
      duckdb::ListVector::SetListSize(result,uVar21);
      pVVar13 = (Vector *)duckdb::ListVector::GetEntry(result);
      duckdb::Vector::Slice(pVVar13,local_130,(ulong)&local_168);
      duckdb::Vector::Flatten((ulong)pVVar13);
      cVar11 = duckdb::DataChunk::AllConstant();
      if (cVar11 != '\0') {
        duckdb::Vector::SetVectorType((VectorType)result);
      }
      if (local_168.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  return;
}

Assistant:

static void ListFlattenFunction(DataChunk &args, ExpressionState &, Vector &result) {

	const auto flat_list_data = FlatVector::GetData<list_entry_t>(result);
	auto &flat_list_mask = FlatVector::Validity(result);

	UnifiedVectorFormat outer_format;
	UnifiedVectorFormat inner_format;
	UnifiedVectorFormat items_format;

	// Setup outer vec;
	auto &outer_vec = args.data[0];
	const auto outer_count = args.size();
	outer_vec.ToUnifiedFormat(outer_count, outer_format);

	// Special case: outer list is all-null
	if (outer_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		result.Reference(outer_vec);
		return;
	}

	// Setup inner vec
	auto &inner_vec = ListVector::GetEntry(outer_vec);
	const auto inner_count = ListVector::GetListSize(outer_vec);
	inner_vec.ToUnifiedFormat(inner_count, inner_format);

	// Special case: inner list is all-null
	if (inner_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
			const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);
			if (!outer_format.validity.RowIsValid(outer_idx)) {
				flat_list_mask.SetInvalid(outer_raw_idx);
				continue;
			}
			flat_list_data[outer_raw_idx].offset = 0;
			flat_list_data[outer_raw_idx].length = 0;
		}
		if (args.AllConstant()) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
		return;
	}

	// Setup items vec
	auto &items_vec = ListVector::GetEntry(inner_vec);
	const auto items_count = ListVector::GetListSize(inner_vec);
	items_vec.ToUnifiedFormat(items_count, items_format);

	// First pass: Figure out the total amount of items.
	// This can be more than items_count if the inner list reference the same item(s) multiple times.

	idx_t total_items = 0;

	const auto outer_data = UnifiedVectorFormat::GetData<list_entry_t>(outer_format);
	const auto inner_data = UnifiedVectorFormat::GetData<list_entry_t>(inner_format);

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			total_items += inner_entry.length;
		}
	}

	// Now we know the total amount of items, we can create our selection vector.
	SelectionVector sel(total_items);
	idx_t sel_idx = 0;

	// Second pass: Fill the selection vector (and the result list entries)

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			flat_list_mask.SetInvalid(outer_raw_idx);
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		list_entry_t list_entry = {sel_idx, 0};

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			list_entry.length += inner_entry.length;

			for (idx_t elem_raw_idx = inner_entry.offset; elem_raw_idx < inner_entry.offset + inner_entry.length;
			     elem_raw_idx++) {
				const auto elem_idx = items_format.sel->get_index(elem_raw_idx);

				sel.set_index(sel_idx, elem_idx);
				sel_idx++;
			}
		}

		// Assign the result list entry
		flat_list_data[outer_raw_idx] = list_entry;
	}

	// Now assing the result
	ListVector::SetListSize(result, sel_idx);

	auto &result_child_vector = ListVector::GetEntry(result);
	result_child_vector.Slice(items_vec, sel, sel_idx);
	result_child_vector.Flatten(sel_idx);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}